

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void store_memop(void *haddr,uint64_t val,MemOp op)

{
  MemOp op_local;
  uint64_t val_local;
  void *haddr_local;
  
  switch(op) {
  case MO_8:
    stb_p(haddr,(uint8_t)val);
    break;
  case MO_16:
    stw_le_p(haddr,(uint16_t)val);
    break;
  case MO_32:
    stl_le_p(haddr,(uint32_t)val);
    break;
  case MO_64:
    stq_le_p(haddr,val);
    break;
  default:
    break;
  case MO_BEUW:
    stw_be_p(haddr,(uint16_t)val);
    break;
  case MO_BEUL:
    stl_be_p(haddr,(uint32_t)val);
    break;
  case MO_BEQ:
    stq_be_p(haddr,val);
  }
  return;
}

Assistant:

static void inline
store_memop(void *haddr, uint64_t val, MemOp op)
{
    switch (op) {
    case MO_UB:
        stb_p(haddr, val);
        break;
    case MO_BEUW:
        stw_be_p(haddr, val);
        break;
    case MO_LEUW:
        stw_le_p(haddr, val);
        break;
    case MO_BEUL:
        stl_be_p(haddr, val);
        break;
    case MO_LEUL:
        stl_le_p(haddr, val);
        break;
    case MO_BEQ:
        stq_be_p(haddr, val);
        break;
    case MO_LEQ:
        stq_le_p(haddr, val);
        break;
    default:
        // qemu_build_not_reached();
        break;
    }
}